

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# glcViewportArrayTests.cpp
# Opt level: O0

void __thiscall
glcts::ViewportArray::ScissorTestStateAPI::getScissorTestStates
          (ScissorTestStateAPI *this,GLint max_viewports,
          vector<unsigned_char,_std::allocator<unsigned_char>_> *out_data)

{
  value_type vVar1;
  int iVar2;
  deUint32 err;
  RenderContext *pRVar3;
  undefined4 extraout_var;
  reference pvVar4;
  int local_2c;
  GLint i;
  Functions *gl;
  vector<unsigned_char,_std::allocator<unsigned_char>_> *out_data_local;
  GLint max_viewports_local;
  ScissorTestStateAPI *this_local;
  
  pRVar3 = deqp::Context::getRenderContext((this->super_TestCaseBase).m_context);
  iVar2 = (*pRVar3->_vptr_RenderContext[3])();
  for (local_2c = 0; local_2c < max_viewports; local_2c = local_2c + 1) {
    vVar1 = (**(code **)(CONCAT44(extraout_var,iVar2) + 0xc80))(0xc11,local_2c);
    pvVar4 = std::vector<unsigned_char,_std::allocator<unsigned_char>_>::operator[]
                       (out_data,(long)local_2c);
    *pvVar4 = vVar1;
    err = (**(code **)(CONCAT44(extraout_var,iVar2) + 0x800))();
    glu::checkError(err,"isEnabledi",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/common/glcViewportArrayTests.cpp"
                    ,0x9bc);
  }
  return;
}

Assistant:

void ScissorTestStateAPI::getScissorTestStates(GLint max_viewports, std::vector<GLboolean>& out_data)
{
	const glw::Functions& gl = m_context.getRenderContext().getFunctions();

	for (GLint i = 0; i < max_viewports; ++i)
	{
		out_data[i] = gl.isEnabledi(GL_SCISSOR_TEST, i);
		GLU_EXPECT_NO_ERROR(gl.getError(), "isEnabledi");
	}
}